

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O0

int32_t WebRtcSpl_MaxValueW32C(int32_t *vector,size_t length)

{
  ulong local_28;
  size_t i;
  int32_t maximum;
  size_t length_local;
  int32_t *vector_local;
  
  i._4_4_ = -0x80000000;
  if (length != 0) {
    for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
      if (i._4_4_ < vector[local_28]) {
        i._4_4_ = vector[local_28];
      }
    }
    return i._4_4_;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,100,"int32_t WebRtcSpl_MaxValueW32C(const int32_t *, size_t)");
}

Assistant:

int32_t WebRtcSpl_MaxValueW32C(const int32_t* vector, size_t length) {
  int32_t maximum = WEBRTC_SPL_WORD32_MIN;
  size_t i = 0;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] > maximum)
      maximum = vector[i];
  }
  return maximum;
}